

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

bool __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::EqualElement<char_const*>::operator()
          (void *this,basic_string_view<char,_std::char_traits<char>_> *lhs,
          basic_string_view<char,_std::char_traits<char>_> *param_2)

{
  StringEq *this_00;
  string_view lhs_00;
  bool bVar1;
  string_view local_40;
  size_t local_30;
  char *local_28;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  basic_string_view<char,_std::char_traits<char>_> *param_2_local;
  basic_string_view<char,_std::char_traits<char>_> *lhs_local;
  EqualElement<const_char_*> *this_local;
  
  this_00 = *(StringEq **)((long)this + 8);
  local_30 = lhs->_M_len;
  local_28 = lhs->_M_str;
  local_20 = param_2;
  param_2_local = lhs;
  lhs_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,(char *)**this)
  ;
  lhs_00._M_str = local_28;
  lhs_00._M_len = local_30;
  bVar1 = StringEq::operator()(this_00,lhs_00,local_40);
  return bVar1;
}

Assistant:

bool operator()(const K2& lhs, Args&&...) const {
      return eq(lhs, rhs);
    }